

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O0

int pico_tree::internal::big_endian_to_native<int>(int v)

{
  size_t i;
  int native;
  byte *v_object;
  int v_local;
  
  native = 0;
  for (i = 0; i < 4; i = i + 1) {
    native = (uint)*(byte *)((long)&v_local + i) << (('\x03' - (char)i) * '\b' & 0x3fU) | native;
  }
  return native;
}

Assistant:

T_ big_endian_to_native(T_ v) {
  static_assert(std::is_integral_v<T_>, "NOT_AN_INTEGRAL_TYPE");
  static_assert(sizeof(T_) <= sizeof(std::size_t), "SIZE_UNSUPPORTED");

  std::byte* v_object = reinterpret_cast<std::byte*>(&v);

  T_ native{};
  for (std::size_t i = 0; i < sizeof(T_); ++i) {
    native |= static_cast<T_>(
        static_cast<std::size_t>(v_object[i]) << ((sizeof(T_) - 1 - i) * 8));
  }

  return native;
}